

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O3

void __thiscall
tcu::x11::glx::GlxRenderContext::GlxRenderContext
          (GlxRenderContext *this,GlxContextFactory *factory,RenderConfig *config)

{
  Functions *this_00;
  Display *pDVar1;
  GlxRenderContext *pGVar2;
  GlxVisual *this_01;
  int iVar3;
  uint uVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  GLXContext p_Var12;
  GlxDrawable *pGVar13;
  NotSupportedError *this_02;
  long lVar14;
  pointer_____offset_0x10___ *ppuVar15;
  int numElems;
  int width;
  Rank local_b0;
  GlxRenderContext *local_a0;
  long local_98;
  int local_8c;
  int local_88;
  deUint32 local_84;
  int local_80;
  int local_7c;
  ulong local_78;
  GlxDisplay *local_70;
  GlxVisual local_68;
  deUint32 local_4c;
  GLXFBConfig local_48;
  GlxContextFactory *local_40;
  GlxVisual *local_38;
  
  (this->super_RenderContext)._vptr_RenderContext = (_func_int **)&PTR__GlxRenderContext_00769970;
  local_70 = &this->m_glxDisplay;
  local_40 = factory;
  GlxDisplay::GlxDisplay(local_70,factory->m_eventState,(char *)0x0);
  pDVar1 = (this->m_glxDisplay).super_XlibDisplay.m_display;
  local_7c = 0;
  local_a0 = this;
  lVar11 = glXGetFBConfigs(pDVar1,*(undefined4 *)(pDVar1 + 0xe0));
  if (lVar11 == 0) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    TestError::TestError
              ((TestError *)this_02,"Couldn\'t query framebuffer configurations",
               "fbConfigs != DE_NULL",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
               ,0x252);
    ppuVar15 = &TestError::typeinfo;
  }
  else {
    local_98 = lVar11;
    if (local_7c < 1) {
      XFree(lVar11);
    }
    else {
      local_38 = &this->m_glxVisual;
      lVar11 = 0;
      local_78 = 0;
      local_48 = (GLXFBConfig)0x0;
      do {
        GlxVisual::GlxVisual(&local_68,local_70,*(GLXFBConfig *)(local_98 + lVar11 * 8));
        if (config->id == -1) {
          lVar14 = 0;
          do {
            iVar3 = *(int *)((long)&(config->type).super_ApiType.m_bits +
                            *(long *)(&DAT_0061f3a8 + lVar14));
            if (iVar3 != -1) {
              iVar8 = GlxVisual::getAttrib(&local_68,*(int *)((long)&s_attribs + lVar14));
              if (iVar3 != iVar8) goto LAB_00288977;
            }
            lVar14 = lVar14 + 0x10;
          } while (lVar14 != 0x80);
          uVar4 = 0;
          if ((ulong)config->surfaceType < 4) {
            uVar4 = *(uint *)(&DAT_0061fa7c + (ulong)config->surfaceType * 4);
          }
          uVar7 = GlxVisual::getAttrib(&local_68,0x8010);
          if (((uVar7 & uVar4) != 0) &&
             ((config->surfaceType != SURFACETYPE_WINDOW ||
              (CONCAT44(local_68.m_visual._4_4_,(int)local_68.m_visual) != 0)))) goto LAB_002886ab;
        }
        else {
          iVar3 = GlxVisual::getAttrib(&local_68,0x8013);
          if (iVar3 == config->id) {
LAB_002886ab:
            iVar3 = GlxVisual::getAttrib(&local_68,5);
            if (iVar3 != 0) {
              uVar4 = GlxVisual::getAttrib(&local_68,0x8011);
              if ((uVar4 & 1) != 0) {
                local_b0.m_value = 0;
                local_b0.m_bitsLeft = 0x40;
                local_80 = GlxVisual::getAttrib(&local_68,0x20);
                local_4c = GlxVisual::getAttrib(&local_68,8);
                dVar5 = GlxVisual::getAttrib(&local_68,9);
                dVar6 = GlxVisual::getAttrib(&local_68,10);
                local_84 = GlxVisual::getAttrib(&local_68,0xb);
                local_88 = GlxVisual::getAttrib(&local_68,0xc);
                local_8c = GlxVisual::getAttrib(&local_68,0xd);
                if ((int)dVar5 < (int)dVar6) {
                  dVar6 = dVar5;
                }
                if ((int)local_4c < (int)dVar6) {
                  dVar6 = local_4c;
                }
                Rank::add(&local_b0,1,(uint)(local_80 != 0x800d));
                iVar3 = GlxVisual::getAttrib(&local_68,0x23);
                Rank::add(&local_b0,1,(uint)(iVar3 == 0x8000));
                iVar3 = GlxVisual::getAttrib(&local_68,6);
                Rank::add(&local_b0,1,(uint)(iVar3 == 0));
                iVar3 = GlxVisual::getAttrib(&local_68,3);
                Rank::add(&local_b0,1,(uint)(iVar3 == 0));
                Rank::add(&local_b0,1,(uint)(0 < (int)local_84));
                Rank::add(&local_b0,1,(uint)(0 < local_88));
                Rank::add(&local_b0,1,(uint)(0 < local_8c));
                Rank::add(&local_b0,1,(uint)(local_80 != 0x8001));
                dVar5 = local_84;
                if ((int)dVar6 < (int)local_84) {
                  dVar5 = dVar6;
                }
                Rank::add(&local_b0,4,dVar5);
                Rank::add(&local_b0,4,dVar6);
                Rank::add(&local_b0,6,local_8c + local_88);
                dVar6 = GlxVisual::getAttrib(&local_68,0x186a1);
                Rank::sub(&local_b0,5,dVar6);
                uVar4 = GlxVisual::getAttrib(&local_68,0x22);
                Rank::add(&local_b0,1,(uint)((uVar4 & 0xfffffffe) == 0x8002));
                if (local_78 < local_b0.m_value) {
                  local_48 = *(GLXFBConfig *)(local_98 + lVar11 * 8);
                  local_78 = local_b0.m_value;
                }
              }
            }
          }
        }
LAB_00288977:
        pGVar2 = local_a0;
        lVar11 = lVar11 + 1;
      } while (lVar11 < local_7c);
      XFree(local_98);
      this_01 = local_38;
      if (local_78 != 0) {
        GlxVisual::GlxVisual(local_38,local_70,local_48);
        (pGVar2->m_type).super_ApiType.m_bits = (config->type).super_ApiType.m_bits;
        p_Var12 = GlxVisual::createContext
                            (this_01,local_40,&config->type,config->resetNotificationStrategy);
        pGVar2->m_GLXContext = p_Var12;
        pGVar13 = createDrawable(this_01,config);
        (pGVar2->m_glxDrawable).
        super_UniqueBase<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_>
        .m_data.ptr = pGVar13;
        local_68.m_display._0_4_ = 0;
        (*pGVar13->_vptr_GlxDrawable[3])(pGVar13,&local_68,0);
        local_98 = CONCAT44(local_98._4_4_,(int)local_68.m_display);
        pGVar13 = (pGVar2->m_glxDrawable).
                  super_UniqueBase<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_>
                  .m_data.ptr;
        local_68.m_display = (GlxDisplay *)((ulong)local_68.m_display._4_4_ << 0x20);
        (*pGVar13->_vptr_GlxDrawable[3])(pGVar13,0);
        iVar3 = (int)local_68.m_display;
        iVar8 = GlxVisual::getAttrib(this_01,8);
        iVar9 = GlxVisual::getAttrib(this_01,9);
        iVar10 = GlxVisual::getAttrib(this_01,10);
        local_68.m_visual._4_4_ = GlxVisual::getAttrib(this_01,0xb);
        local_68.m_display = (GlxDisplay *)CONCAT44(iVar9,iVar8);
        local_68.m_visual._0_4_ = iVar10;
        iVar8 = GlxVisual::getAttrib(this_01,0xc);
        iVar9 = GlxVisual::getAttrib(this_01,0xd);
        iVar10 = GlxVisual::getAttrib(this_01,0x186a1);
        RenderTarget::RenderTarget
                  (&local_a0->m_renderTarget,(int)local_98,iVar3,(PixelFormat *)&local_68,iVar8,
                   iVar9,iVar10);
        pGVar2 = local_a0;
        this_00 = &local_a0->m_functions;
        glw::Functions::Functions(this_00);
        local_68.m_display = (GlxDisplay *)&PTR_get_00769aa8;
        (*(pGVar2->super_RenderContext)._vptr_RenderContext[8])(pGVar2);
        glu::initFunctions(this_00,(FunctionLoader *)&local_68,
                           (ApiType)((config->type).super_ApiType.m_bits & 0x3ff));
        return;
      }
    }
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    NotSupportedError::NotSupportedError
              (this_02,"Requested GLX configuration not found or unusable",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
               ,0x26d);
    ppuVar15 = &NotSupportedError::typeinfo;
  }
  __cxa_throw(this_02,ppuVar15,Exception::~Exception);
}

Assistant:

GlxRenderContext::GlxRenderContext (const GlxContextFactory&	factory,
									const RenderConfig&			config)
	: m_glxDisplay		(factory.getEventState(), DE_NULL)
	, m_glxVisual		(chooseVisual(m_glxDisplay, config))
	, m_type			(config.type)
	, m_GLXContext		(m_glxVisual.createContext(factory, config.type, config.resetNotificationStrategy))
	, m_glxDrawable		(createDrawable(m_glxVisual, config))
	, m_renderTarget	(m_glxDrawable->getWidth(), m_glxDrawable->getHeight(),
						 PixelFormat(m_glxVisual.getAttrib(GLX_RED_SIZE),
									 m_glxVisual.getAttrib(GLX_GREEN_SIZE),
									 m_glxVisual.getAttrib(GLX_BLUE_SIZE),
									 m_glxVisual.getAttrib(GLX_ALPHA_SIZE)),
						 m_glxVisual.getAttrib(GLX_DEPTH_SIZE),
						 m_glxVisual.getAttrib(GLX_STENCIL_SIZE),
						 m_glxVisual.getAttrib(GLX_SAMPLES))
{
	const GlxFunctionLoader loader;
	makeCurrent();
	glu::initFunctions(&m_functions, &loader, config.type.getAPI());
}